

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.c
# Opt level: O0

void * stdout_new(t_symbol *s,int argc,t_atom *argv)

{
  t_pd *pp_Var1;
  _binbuf **pp_Var2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  int iVar5;
  t_stdout *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  pp_Var1 = pd_new(stdout_class);
  x = (t_stdout *)argv;
  argv_local._4_4_ = argc;
  while (iVar5 = argv_local._4_4_ + -1, argv_local._4_4_ != 0) {
    pp_Var2 = &(x->x_obj).te_binbuf;
    ptVar3 = atom_getsymbol((t_atom *)x);
    ptVar4 = gensym("-cr");
    x = (t_stdout *)pp_Var2;
    argv_local._4_4_ = iVar5;
    if (ptVar4 == ptVar3) {
      *(undefined4 *)(pp_Var1 + 6) = 1;
    }
    else {
      ptVar4 = gensym("-b");
      if ((ptVar4 == ptVar3) || (ptVar4 = gensym("-binary"), ptVar4 == ptVar3)) {
        *(undefined4 *)(pp_Var1 + 6) = 2;
      }
      else {
        ptVar4 = gensym("-f");
        if ((ptVar4 == ptVar3) || (ptVar4 = gensym("-flush"), ptVar4 == ptVar3)) {
          *(undefined4 *)((long)pp_Var1 + 0x34) = 1;
        }
        else {
          ptVar4 = gensym("-nf");
          if ((ptVar4 == ptVar3) || (ptVar4 = gensym("-noflush"), ptVar4 == ptVar3)) {
            *(undefined4 *)((long)pp_Var1 + 0x34) = 0;
          }
          else {
            gensym("");
          }
        }
      }
    }
  }
  ptVar3 = gensym("#pd_binary_stdio");
  if (ptVar3->s_thing != (_class **)0x0) {
    *(undefined4 *)(pp_Var1 + 6) = 3;
  }
  return pp_Var1;
}

Assistant:

static void *stdout_new(t_symbol*s, int argc, t_atom*argv)
{
    t_stdout *x = (t_stdout *)pd_new(stdout_class);
        /* for some reason in MS windows we have to flush standard out here -
        otherwise these outputs get out of order from the ones from pdsched.c
        over in ../pd~.  I'm guessing mingw (with its different C runtime
        support) will handle this correctly and so am only ifdeffing this on
        Microsoft C compiler.  It's an efficiency hit, possibly a serious
        one. */
#ifdef _MSC_VER
    x->x_flush = 1;
#endif

    while(argc--)
    {
        s = atom_getsymbol(argv++);
        if (gensym("-cr") == s)
        {
                /* No-semicolon mode */
            x->x_mode = MODE_CR;
        }
        else if ((gensym("-b") == s) || (gensym("-binary") == s))
        {
                /* Binary mode:
                   no extra characters (semicolons, CR,...) is appended
                 */
            x->x_mode = MODE_BIN;
        }
        else if ((gensym("-f") == s) || (gensym("-flush") == s))
        {
            x->x_flush = 1;
        }
        else if ((gensym("-nf") == s) || (gensym("-noflush") == s))
        {
            x->x_flush = 0;
        }
        else if (gensym("") != s)
        {
                /* unknown mode; ignore it */
        }
    }
    if (gensym("#pd_binary_stdio")->s_thing)
        x->x_mode = MODE_PDTILDE;
    return (x);
}